

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramUniformTests.cpp
# Opt level: O0

void __thiscall deqp::gles31::Functional::UniformCase::deinit(UniformCase *this)

{
  TextureCube *this_00;
  size_type sVar1;
  reference ppTVar2;
  reference ppTVar3;
  int local_18;
  int local_14;
  int i_1;
  int i;
  UniformCase *this_local;
  
  local_14 = 0;
  while( true ) {
    sVar1 = std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::size
                      (&this->m_textures2d);
    if ((int)sVar1 <= local_14) break;
    ppTVar2 = std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::operator[]
                        (&this->m_textures2d,(long)local_14);
    if (*ppTVar2 != (value_type)0x0) {
      (*(*ppTVar2)->_vptr_Texture2D[1])();
    }
    local_14 = local_14 + 1;
  }
  std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::clear(&this->m_textures2d);
  local_18 = 0;
  while( true ) {
    sVar1 = std::vector<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>::size
                      (&this->m_texturesCube);
    if ((int)sVar1 <= local_18) break;
    ppTVar3 = std::vector<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>::operator[]
                        (&this->m_texturesCube,(long)local_18);
    this_00 = *ppTVar3;
    if (this_00 != (TextureCube *)0x0) {
      glu::TextureCube::~TextureCube(this_00);
      operator_delete(this_00,0x180);
    }
    local_18 = local_18 + 1;
  }
  std::vector<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>::clear(&this->m_texturesCube)
  ;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(&this->m_filledTextureUnits);
  return;
}

Assistant:

void UniformCase::deinit (void)
{
	for (int i = 0; i < (int)m_textures2d.size(); i++)
		delete m_textures2d[i];
	m_textures2d.clear();

	for (int i = 0; i < (int)m_texturesCube.size(); i++)
		delete m_texturesCube[i];
	m_texturesCube.clear();

	m_filledTextureUnits.clear();
}